

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall asmjit::BaseBuilder::~BaseBuilder(BaseBuilder *this)

{
  ~BaseBuilder(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

BaseBuilder::~BaseBuilder() noexcept {
  BaseBuilder_deletePasses(this);
}